

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip_file_zip64.c
# Opt level: O1

void test_write_format_zip_file_zip64(void)

{
  ushort *_v1;
  uint uVar1;
  long lVar2;
  tm *ptVar3;
  int iVar4;
  uint uVar5;
  void *buff;
  archive *_a;
  archive_entry *entry;
  ssize_t v2;
  ushort *puVar6;
  ulong uVar7;
  void *_v1_00;
  long lVar8;
  ushort *puVar9;
  ushort *puVar10;
  ulong v2_00;
  uchar *p;
  byte *buff_00;
  time_t t;
  size_t used;
  char file_data [8];
  time_t local_68;
  tm *local_60;
  ulong local_58;
  ulong local_50;
  void *local_48;
  size_t local_40;
  undefined8 local_38;
  
  local_68 = 0x499602d2;
  local_60 = localtime(&local_68);
  buff_00 = (byte *)&local_38;
  local_38 = 0x3837363534333231;
  buff = malloc(1000000);
  _a = archive_write_new();
  v2_00 = 0;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                   ,L'b',(uint)(_a != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar4 = archive_write_set_format_zip(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'c',0,"ARCHIVE_OK",(long)iVar4,"archive_write_set_format_zip(a)",_a);
  iVar4 = archive_write_set_options(_a,"zip:zip64");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'e',0,"ARCHIVE_OK",(long)iVar4,"archive_write_set_options(a, \"zip:zip64\")"
                      ,_a);
  iVar4 = archive_write_set_options(_a,"zip:experimental");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'g',0,"ARCHIVE_OK",(long)iVar4,
                      "archive_write_set_options(a, \"zip:experimental\")",_a);
  iVar4 = archive_write_open_memory(_a,buff,1000000,&local_40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'i',0,"ARCHIVE_OK",(long)iVar4,
                      "archive_write_open_memory(a, buff, buffsize, &used)",_a);
  entry = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                   ,L'k',(uint)(entry != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL",
                   (void *)0x0);
  archive_entry_copy_pathname(entry,"file");
  archive_entry_set_mode(entry,0x81a4);
  lVar8 = 8;
  archive_entry_set_size(entry,8);
  archive_entry_set_uid(entry,10);
  archive_entry_set_gid(entry,0x14);
  archive_entry_set_mtime(entry,local_68,0);
  iVar4 = archive_write_header(_a,entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'r',0,"0",(long)iVar4,"archive_write_header(a, ae)",(void *)0x0);
  archive_entry_free(entry);
  v2 = archive_write_data(_a,buff_00,8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L't',8,"8",v2,"archive_write_data(a, file_data, sizeof(file_data))",
                      (void *)0x0);
  iVar4 = archive_write_close(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'u',0,"ARCHIVE_OK",(long)iVar4,"archive_write_close(a)",_a);
  iVar4 = archive_write_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'v',0,"ARCHIVE_OK",(long)iVar4,"archive_write_free(a)",(void *)0x0);
  dumpfile("constructed.zip",buff,local_40);
  _v1_00 = (void *)((long)buff + (local_40 - 0x16));
  failure("End-of-central-directory begins with PK\\005\\006 signature");
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'~',_v1_00,"p","PK\x05\x06","\"PK\\005\\006\"",4,"4",(void *)0x0);
  failure("This must be disk 0");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x80',(ulong)*(ushort *)((long)buff + (local_40 - 0x12)),"i2(p + 4)",0,"0",
                      (void *)0x0);
  failure("Central dir must start on disk 0");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x82',(ulong)*(ushort *)((long)buff + (local_40 - 0x10)),"i2(p + 6)",0,"0",
                      (void *)0x0);
  failure("All central dir entries are on this disk");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x84',(ulong)*(ushort *)((long)buff + (local_40 - 0xe)),"i2(p + 8)",
                      (ulong)*(ushort *)((long)buff + (local_40 - 0xc)),"i2(p + 10)",(void *)0x0);
  uVar1 = *(uint *)((long)buff + (local_40 - 10));
  local_58 = (ulong)*(uint *)((long)buff + (local_40 - 6));
  failure("no zip comment");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x87',(ulong)*(ushort *)((long)buff + (local_40 - 2)),"i2(p + 20)",0,"0",
                      (void *)0x0);
  uVar7 = (ulong)*(uint *)((long)buff + (local_40 - 6));
  _v1 = (ushort *)(uVar7 + (long)buff);
  local_48 = _v1_00;
  failure("Central file record at offset %d should begin with PK\\001\\002 signature",
          (ulong)*(uint *)((long)buff + (local_40 - 10)));
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x90',_v1,"p","PK\x01\x02","\"PK\\001\\002\"",4,"4",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x91',(ulong)*(ushort *)((long)buff + uVar7 + 4),"i2(p + 4)",0x32d,
                      "3 * 256 + zip_version",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x92',(ulong)*(ushort *)((long)buff + uVar7 + 6),"i2(p + 6)",0x2d,
                      "zip_version",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x93',(ulong)*(ushort *)((long)buff + uVar7 + 8),"i2(p + 8)",8,"8",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x94',(ulong)*(ushort *)((long)buff + uVar7 + 10),"i2(p + 10)",8,
                      "zip_compression",(void *)0x0);
  ptVar3 = local_60;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x95',(ulong)*(ushort *)((long)buff + uVar7 + 0xc),"i2(p + 12)",
                      (long)(local_60->tm_sec / 2 +
                            local_60->tm_min * 0x20 + local_60->tm_hour * 0x800),
                      "(tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)",(void *)0x0);
  local_50 = uVar7;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x96',(ulong)*(ushort *)((long)buff + uVar7 + 0xe),"i2(p + 14)",
                      (long)(ptVar3->tm_mon * 0x20 + ptVar3->tm_year * 0x200 + -0x9fe0) +
                      (long)ptVar3->tm_mday,
                      "((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday",
                      (void *)0x0);
  do {
    v2_00 = v2_00 ^ *buff_00;
    uVar5 = 9;
    do {
      uVar7 = v2_00 >> 1 ^ 0xedb88320;
      if ((v2_00 & 1) != 0) {
        uVar7 = v2_00 >> 1;
      }
      v2_00 = uVar7 ^ 0x80000000;
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
    buff_00 = buff_00 + 1;
    lVar8 = lVar8 + -1;
  } while (lVar8 != 0);
  puVar6 = (ushort *)((long)buff + local_58 + uVar1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x98',(ulong)*(uint *)(_v1 + 8),"i4(p + 16)",v2_00,"crc",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x9a',(ulong)*(uint *)(_v1 + 0xc),"i4(p + 24)",8,"sizeof(file_data)",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x9b',(ulong)_v1[0xe],"i2(p + 28)",4,"strlen(file_name)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x9d',(ulong)_v1[0x10],"i2(p + 32)",0,"0",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x9e',(ulong)_v1[0x11],"i2(p + 34)",0,"0",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x9f',(ulong)_v1[0x12],"i2(p + 36)",0,"0",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\xa0',(ulong)((*(byte *)((long)_v1 + 0x29) & 3) << 8) |
                               (ulong)(byte)_v1[0x14],"i4(p + 38) >> 16 & 01777",0x1a4,"file_perm",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'¡',(ulong)*(uint *)(_v1 + 0x15),"i4(p + 42)",0,"0",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'¢',_v1 + 0x17,"p + 46","file","file_name",4,"strlen(file_name)",
                      (void *)0x0);
  puVar9 = (ushort *)((long)_v1 + (ulong)_v1[0xf] + 0x32);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'¦',(ulong)_v1[0x19],"i2(p)",0x5455,"0x5455",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'§',(ulong)_v1[0x1a],"i2(p + 2)",5,"5",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'¨',(ulong)(byte)_v1[0x1b],"p[4]",1,"1",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'©',(ulong)*(uint *)((long)_v1 + 0x37),"i4(p + 5)",local_68,"t",(void *)0x0
                     );
  uVar7 = (ulong)_v1[0x1a];
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'¬',(ulong)*(ushort *)((long)_v1 + uVar7 + 0x36),"i2(p)",0x7875,"0x7875",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'­',(ulong)*(ushort *)((long)_v1 + uVar7 + 0x38),"i2(p + 2)",0xb,"11",
                      (void *)0x0);
  for (puVar10 = (ushort *)((long)_v1 + *(ushort *)((long)_v1 + uVar7 + 0x38) + uVar7 + 0x3a);
      puVar10 < puVar9; puVar10 = (ushort *)((long)puVar10 + (ulong)puVar10[1] + 4)) {
    failure("Unexpected extension 0x%04X",(ulong)*puVar10);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                     ,L'º',L'\0',"0",(void *)0x0);
  }
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                   ,L'¿',(uint)(puVar10 == puVar9),"p == extension_end",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                   ,L'Á',(uint)(puVar10 == puVar6),"p == eocd",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Ä',puVar10,"p","PK\x06\x06","\"PK\\006\\006\"",4,"4",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Å',(ulong)*(uint *)(puVar10 + 2),"i8(p + 4)",0x2c,"44",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Æ',(ulong)puVar10[6],"i2(p + 12)",0x2d,"45",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Ç',(ulong)puVar10[7],"i2(p + 14)",0x2d,"45",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'È',(ulong)*(uint *)(puVar10 + 8),"i4(p + 16)",0,"0",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'É',(ulong)*(uint *)(puVar10 + 10),"i4(p + 20)",0,"0",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Ê',(ulong)*(uint *)(puVar10 + 0xc),"i8(p + 24)",1,"1",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Ë',(ulong)*(uint *)(puVar10 + 0x10),"i8(p + 32)",1,"1",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Ì',(ulong)*(uint *)(puVar10 + 0x14),"i8(p + 40)",(long)puVar6 - (long)_v1,
                      "eocd - central_header",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Í',(ulong)*(uint *)(puVar10 + 0x18),"i8(p + 48)",local_50,
                      "central_header - buff",(void *)0x0);
  uVar7 = (ulong)(*(int *)(puVar10 + 2) + 0xc);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Ð',(void *)(uVar7 + (long)puVar10),"p","PK\x06\a","\"PK\\006\\007\"",4,"4"
                      ,(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Ñ',(ulong)*(uint *)((long)puVar10 + uVar7 + 4),"i4(p + 4)",0,"0",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Ò',(ulong)*(uint *)((long)puVar10 + uVar7 + 8),"i8(p + 8)",
                      (long)puVar6 - (long)buff,"eocd - buff",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Ó',(ulong)*(uint *)((long)puVar10 + uVar7 + 0x10),"i4(p + 16)",1,"1",
                      (void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                   ,L'×',(uint)((void *)((long)puVar10 + uVar7 + 0x14) == local_48),
                   "p == eocd_record",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Û',buff,"p","PK\x03\x04","\"PK\\003\\004\"",4,"4",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Ü',(ulong)*(ushort *)((long)buff + 4),"i2(p + 4)",0x2d,"zip_version",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Ý',(ulong)*(ushort *)((long)buff + 6),"i2(p + 6)",8,"8",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Þ',(ulong)*(ushort *)((long)buff + 8),"i2(p + 8)",8,"zip_compression",
                      (void *)0x0);
  ptVar3 = local_60;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'ß',(ulong)*(ushort *)((long)buff + 10),"i2(p + 10)",
                      (long)(local_60->tm_sec / 2 +
                            local_60->tm_min * 0x20 + local_60->tm_hour * 0x800),
                      "(tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'à',(ulong)*(ushort *)((long)buff + 0xc),"i2(p + 12)",
                      (long)(ptVar3->tm_mon * 0x20 + ptVar3->tm_year * 0x200 + -0x9fe0) +
                      (long)ptVar3->tm_mday,
                      "((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'á',(ulong)*(uint *)((long)buff + 0xe),"i4(p + 14)",0,"0",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'ä',(ulong)*(ushort *)((long)buff + 0x1a),"i2(p + 26)",4,
                      "strlen(file_name)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'å',(ulong)*(ushort *)((long)buff + 0x1c),"i2(p + 28)",0x39,"57",
                      (void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'æ',(void *)((long)buff + 0x1e),"p + 30","file","file_name",4,
                      "strlen(file_name)",(void *)0x0);
  puVar6 = (ushort *)((long)buff + (ulong)*(ushort *)((long)buff + 0x1c) + 0x22);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'ê',(ulong)*(ushort *)((long)buff + 0x22),"i2(p)",0x5455,"0x5455",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'ë',(ulong)*(ushort *)((long)buff + 0x24),"i2(p + 2)",5,"5",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'ì',(ulong)*(byte *)((long)buff + 0x26),"p[4]",1,"1",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'í',(ulong)*(uint *)((long)buff + 0x27),"i4(p + 5)",local_68,"t",
                      (void *)0x0);
  uVar7 = (ulong)*(ushort *)((long)buff + 0x24);
  lVar8 = uVar7 + 0x22;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'ð',(ulong)*(ushort *)((long)buff + uVar7 + 0x26),"i2(p)",0x7875,"0x7875",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'ñ',(ulong)*(ushort *)((long)buff + uVar7 + 0x28),"i2(p + 2)",0xb,"11",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'ò',(ulong)*(byte *)((long)buff + uVar7 + 0x2a),"p[4]",1,"1",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'ó',(ulong)*(byte *)((long)buff + uVar7 + 0x2b),"p[5]",4,"4",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'ô',(ulong)*(uint *)((long)buff + uVar7 + 0x2c),"i4(p + 6)",10,"file_uid",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'õ',(ulong)*(byte *)((long)buff + uVar7 + 0x30),"p[10]",4,"4",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'ö',(ulong)*(uint *)((long)buff + uVar7 + 0x31),"i4(p + 11)",0x14,
                      "file_gid",(void *)0x0);
  uVar7 = (ulong)*(ushort *)((long)buff + uVar7 + 0x28);
  lVar2 = uVar7 + lVar8 + 4;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'ù',(ulong)*(ushort *)((long)buff + uVar7 + 8 + lVar8),"i2(p)",1,"0x0001",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'ú',(ulong)*(ushort *)((long)buff + uVar7 + 10 + lVar8),"i2(p + 2)",0x10,
                      "16",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'û',(ulong)*(uint *)((long)buff + uVar7 + 0xc + lVar8),"i8(p + 4)",8,"8",
                      (void *)0x0);
  uVar7 = (ulong)*(ushort *)((long)buff + uVar7 + 10 + lVar8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'ÿ',(ulong)*(ushort *)((long)buff + uVar7 + 8 + lVar2),"i2(p)",0x6c65,
                      "0x6c65",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Ā',(ulong)*(ushort *)((long)buff + uVar7 + 10 + lVar2),"i2(p + 2)",9,"9",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'ā',(ulong)*(byte *)((long)buff + uVar7 + 0xc + lVar2),"p[4]",7,"7",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Ă',(ulong)*(byte *)((long)buff + uVar7 + 0xe + lVar2),"i2(p + 5) >> 8",3,
                      "3",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'ă',(ulong)*(ushort *)((long)buff + uVar7 + 0xf + lVar2),"i2(p + 7)",0,"0",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Ą',(ulong)((*(byte *)((long)buff + uVar7 + 0x14 + lVar2) & 3) << 8) |
                             (ulong)*(byte *)((long)buff + uVar7 + 0x13 + lVar2),
                      "i4(p + 9) >> 16 & 01777",0x1a4,"file_perm",(void *)0x0);
  for (puVar10 = (ushort *)
                 ((long)buff +
                 (ulong)*(ushort *)((long)buff + uVar7 + 10 + lVar2) + uVar7 + lVar2 + 0xc);
      puVar10 < puVar6; puVar10 = (ushort *)((long)puVar10 + (ulong)puVar10[1] + 4)) {
    failure("Unexpected extension 0x%04X",(ulong)*puVar10);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                     ,L'Ċ',L'\0',"0",(void *)0x0);
  }
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                   ,L'ď',(uint)(puVar10 == puVar6),"p == extension_end",(void *)0x0);
  for (; (puVar10 < _v1 && (*(int *)puVar10 != 0x8074b50)); puVar10 = (ushort *)((long)puVar10 + 1))
  {
  }
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Ĕ',puVar10,"p","PK\a\b","\"PK\\007\\010\"",4,"4",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'ĕ',(ulong)*(uint *)(puVar10 + 2),"i4(p + 4)",v2_00,"crc",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'ė',(ulong)*(uint *)(puVar10 + 8),"i8(p + 16)",8,"sizeof(file_data)",
                      (void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                   ,L'Ě',(uint)(puVar10 + 0xc == _v1),"p + 24 == central_header",(void *)0x0);
  free(buff);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_zip_file_zip64)
{
	struct archive *a;
	struct archive_entry *ae;
	time_t t = 1234567890;
	struct tm *tm = localtime(&t);
	size_t used, buffsize = 1000000;
	unsigned long crc;
	int file_perm = 00644;
	int zip_version = 45;
	int zip_compression = 8;
	short file_uid = 10, file_gid = 20;
	unsigned char *buff, *buffend, *p;
	unsigned char *central_header, *local_header, *eocd, *eocd_record;
	unsigned char *extension_start, *extension_end;
	char file_data[] = {'1', '2', '3', '4', '5', '6', '7', '8'};
	char *file_name = "file";

#ifndef HAVE_ZLIB_H
	zip_compression = 0;
#endif

	buff = malloc(buffsize);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "zip:zip64"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "zip:experimental"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));

	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, file_name);
	archive_entry_set_mode(ae, AE_IFREG | file_perm);
	archive_entry_set_size(ae, sizeof(file_data));
	archive_entry_set_uid(ae, file_uid);
	archive_entry_set_gid(ae, file_gid);
	archive_entry_set_mtime(ae, t, 0);
	assertEqualInt(0, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(8, archive_write_data(a, file_data, sizeof(file_data)));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));
	buffend = buff + used;
	dumpfile("constructed.zip", buff, used);

	/* Verify "End of Central Directory" record. */
	/* Get address of end-of-central-directory record. */
	eocd_record = p = buffend - 22; /* Assumes there is no zip comment field. */
	failure("End-of-central-directory begins with PK\\005\\006 signature");
	assertEqualMem(p, "PK\005\006", 4);
	failure("This must be disk 0");
	assertEqualInt(i2(p + 4), 0);
	failure("Central dir must start on disk 0");
	assertEqualInt(i2(p + 6), 0);
	failure("All central dir entries are on this disk");
	assertEqualInt(i2(p + 8), i2(p + 10));
	eocd = buff + i4(p + 12) + i4(p + 16);
	failure("no zip comment");
	assertEqualInt(i2(p + 20), 0);

	/* Get address of first entry in central directory. */
	central_header = p = buff + i4(buffend - 6);
	failure("Central file record at offset %d should begin with"
	    " PK\\001\\002 signature",
	    i4(buffend - 10));

	/* Verify file entry in central directory. */
	assertEqualMem(p, "PK\001\002", 4); /* Signature */
	assertEqualInt(i2(p + 4), 3 * 256 + zip_version); /* Version made by */
	assertEqualInt(i2(p + 6), zip_version); /* Version needed to extract */
	assertEqualInt(i2(p + 8), 8); /* Flags */
	assertEqualInt(i2(p + 10), zip_compression); /* Compression method */
	assertEqualInt(i2(p + 12), (tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)); /* File time */
	assertEqualInt(i2(p + 14), ((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday); /* File date */
	crc = bitcrc32(0, file_data, sizeof(file_data));
	assertEqualInt(i4(p + 16), crc); /* CRC-32 */
	/* assertEqualInt(i4(p + 20), sizeof(file_data)); */ /* Compressed size */
	assertEqualInt(i4(p + 24), sizeof(file_data)); /* Uncompressed size */
	assertEqualInt(i2(p + 28), strlen(file_name)); /* Pathname length */
	/* assertEqualInt(i2(p + 30), 28); */ /* Extra field length: See below */
	assertEqualInt(i2(p + 32), 0); /* File comment length */
	assertEqualInt(i2(p + 34), 0); /* Disk number start */
	assertEqualInt(i2(p + 36), 0); /* Internal file attrs */
	assertEqualInt(i4(p + 38) >> 16 & 01777, file_perm); /* External file attrs */
	assertEqualInt(i4(p + 42), 0); /* Offset of local header */
	assertEqualMem(p + 46, file_name, strlen(file_name)); /* Pathname */
	p = extension_start = central_header + 46 + strlen(file_name);
	extension_end = extension_start + i2(central_header + 30);

	assertEqualInt(i2(p), 0x5455);  /* 'UT' extension header */
	assertEqualInt(i2(p + 2), 5); /* 'UT' size */
	assertEqualInt(p[4], 1); /* 'UT' flags */
	assertEqualInt(i4(p + 5), t); /* 'UT' mtime */
	p += 4 + i2(p + 2);

	assertEqualInt(i2(p), 0x7875);  /* 'ux' extension header */
	assertEqualInt(i2(p + 2), 11); /* 'ux' size */
	/* TODO: verify 'ux' contents */
	p += 4 + i2(p + 2);

	/* Note: We don't expect to see zip64 extension in the central
	 * directory, since the writer knows the actual full size by
	 * the time it is ready to write the central directory and has
	 * no reason to insert it then.  Info-Zip seems to do the same
	 * thing. */

	/* Just in case: Report any extra extensions. */
	while (p < extension_end) {
		failure("Unexpected extension 0x%04X", i2(p));
		assert(0);
		p += 4 + i2(p + 2);
	}

	/* Should have run exactly to end of extra data. */
	assert(p == extension_end);

	assert(p == eocd);

	/* After Central dir, we find Zip64 eocd and Zip64 eocd locator. */
	assertEqualMem(p, "PK\006\006", 4); /* Zip64 eocd */
	assertEqualInt(i8(p + 4), 44); /* We're using v1 Zip64 eocd */
	assertEqualInt(i2(p + 12), 45); /* Written by Version 4.5 */
	assertEqualInt(i2(p + 14), 45); /* Needs version 4.5 to extract */
	assertEqualInt(i4(p + 16), 0); /* This is disk #0 */
	assertEqualInt(i4(p + 20), 0); /* Dir starts on disk #0 */
	assertEqualInt(i8(p + 24), 1); /* 1 entry on this disk */
	assertEqualInt(i8(p + 32), 1); /* 1 entry total */
	assertEqualInt(i8(p + 40), eocd - central_header); /* size of cd */
	assertEqualInt(i8(p + 48), central_header - buff); /* start of cd */
	p += 12 + i8(p + 4);

	assertEqualMem(p, "PK\006\007", 4); /* Zip64 eocd locator */
	assertEqualInt(i4(p + 4), 0); /* Zip64 eocd is on disk #0 */
	assertEqualInt(i8(p + 8), eocd - buff); /* Offset of Zip64 eocd */
	assertEqualInt(i4(p + 16), 1); /* 1 disk */
	p += 20;

	/* Regular EOCD immediately follows Zip64 records. */
	assert(p == eocd_record);

	/* Verify local header of file entry. */
	p = local_header = buff;
	assertEqualMem(p, "PK\003\004", 4); /* Signature */
	assertEqualInt(i2(p + 4), zip_version); /* Version needed to extract */
	assertEqualInt(i2(p + 6), 8); /* Flags */
	assertEqualInt(i2(p + 8), zip_compression); /* Compression method */
	assertEqualInt(i2(p + 10), (tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)); /* File time */
	assertEqualInt(i2(p + 12), ((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday); /* File date */
	assertEqualInt(i4(p + 14), 0); /* CRC-32 */
	/* assertEqualInt(i4(p + 18), sizeof(file_data)); */ /* Compressed size */
	/* assertEqualInt(i4(p + 22), sizeof(file_data)); */ /* Uncompressed size not stored because we're using length-at-end. */
	assertEqualInt(i2(p + 26), strlen(file_name)); /* Pathname length */
	assertEqualInt(i2(p + 28), 57); /* Extra field length */
	assertEqualMem(p + 30, file_name, strlen(file_name)); /* Pathname */
	p = extension_start = local_header + 30 + strlen(file_name);
	extension_end = extension_start + i2(local_header + 28);

	assertEqualInt(i2(p), 0x5455);  /* 'UT' extension header */
	assertEqualInt(i2(p + 2), 5); /* 'UT' size */
	assertEqualInt(p[4], 1); /* 'UT' flags */
	assertEqualInt(i4(p + 5), t); /* 'UT' mtime */
	p += 4 + i2(p + 2);

	assertEqualInt(i2(p), 0x7875);  /* 'ux' extension header */
	assertEqualInt(i2(p + 2), 11); /* 'ux' size */
	assertEqualInt(p[4], 1); /* 'ux' version */
	assertEqualInt(p[5], 4); /* 'ux' uid size */
	assertEqualInt(i4(p + 6), file_uid); /* 'Ux' UID */
	assertEqualInt(p[10], 4); /* 'ux' gid size */
	assertEqualInt(i4(p + 11), file_gid); /* 'Ux' GID */
	p += 4 + i2(p + 2);

	assertEqualInt(i2(p), 0x0001);  /* Zip64 extension header */
	assertEqualInt(i2(p + 2), 16); /* size */
	assertEqualInt(i8(p + 4), 8); /* uncompressed file size */
	/* compressed file size we can't verify here */
	p += 4 + i2(p + 2);

	assertEqualInt(i2(p), 0x6c65); /* 'el' experimental extension header */
	assertEqualInt(i2(p + 2), 9); /* size */
	assertEqualInt(p[4], 7); /* bitmap of included fields */
	assertEqualInt(i2(p + 5) >> 8, 3); /* system & version made by */
	assertEqualInt(i2(p + 7), 0); /* internal file attributes */
	assertEqualInt(i4(p + 9) >> 16 & 01777, file_perm); /* external file attributes */
	p += 4 + i2(p + 2);

	/* Just in case: Report any extra extensions. */
	while (p < extension_end) {
		failure("Unexpected extension 0x%04X", i2(p));
		assert(0);
		p += 4 + i2(p + 2);
	}

	/* Should have run exactly to end of extra data. */
	assert(p == extension_end);

	/* Data descriptor should follow compressed data. */
	while (p < central_header && memcmp(p, "PK\007\010", 4) != 0)
		++p;
	assertEqualMem(p, "PK\007\010", 4);
	assertEqualInt(i4(p + 4), crc); /* CRC-32 */
	/* assertEqualInt(i8(p + 8), ???); */ /* compressed size */
	assertEqualInt(i8(p + 16), sizeof(file_data)); /* uncompressed size */

	/* Central directory should immediately follow the only entry. */
	assert(p + 24 == central_header);

	free(buff);
}